

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O3

void Nf_ManPreparePrint(int nVars,int *pComp,int *pPerm,char (*Line) [8])

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  bool bVar25;
  bool bVar26;
  uint uVar27;
  byte bVar28;
  byte bVar29;
  undefined8 uVar30;
  int *piVar31;
  char *pcVar32;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  char (*pacVar37) [8];
  long lVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar49;
  int iVar51;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  long lVar50;
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar72;
  undefined1 auVar70 [16];
  int iVar73;
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int iVar87;
  int iVar91;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  uint local_58;
  long lVar53;
  
  uVar27 = Extra_Factorial(nVars);
  auVar24 = _DAT_00912220;
  bVar28 = (byte)nVars;
  uVar34 = 1 << (bVar28 & 0x1f);
  if (0 < nVars) {
    lVar33 = (ulong)(uint)nVars - 1;
    auVar39._8_4_ = (int)lVar33;
    auVar39._0_8_ = lVar33;
    auVar39._12_4_ = (int)((ulong)lVar33 >> 0x20);
    pcVar32 = Line[1] + 7;
    lVar33 = 0;
    auVar40 = auVar39;
    auVar52 = _DAT_00981ea0;
    auVar54 = _DAT_00981eb0;
    auVar55 = _DAT_00981ec0;
    auVar56 = _DAT_00981ed0;
    auVar57 = _DAT_00981ee0;
    auVar58 = _DAT_00981ef0;
    auVar59 = _DAT_009134e0;
    auVar60 = _DAT_00912210;
    do {
      auVar70 = auVar39 ^ auVar24;
      auVar74 = auVar60 ^ auVar24;
      iVar49 = auVar70._0_4_;
      iVar87 = -(uint)(iVar49 < auVar74._0_4_);
      iVar51 = auVar70._4_4_;
      auVar76._4_4_ = -(uint)(iVar51 < auVar74._4_4_);
      iVar72 = auVar70._8_4_;
      iVar91 = -(uint)(iVar72 < auVar74._8_4_);
      iVar73 = auVar70._12_4_;
      auVar76._12_4_ = -(uint)(iVar73 < auVar74._12_4_);
      auVar70._4_4_ = iVar87;
      auVar70._0_4_ = iVar87;
      auVar70._8_4_ = iVar91;
      auVar70._12_4_ = iVar91;
      auVar70 = pshuflw(auVar40,auVar70,0xe8);
      auVar75._4_4_ = -(uint)(auVar74._4_4_ == iVar51);
      auVar75._12_4_ = -(uint)(auVar74._12_4_ == iVar73);
      auVar75._0_4_ = auVar75._4_4_;
      auVar75._8_4_ = auVar75._12_4_;
      auVar61 = pshuflw(in_XMM11,auVar75,0xe8);
      auVar76._0_4_ = auVar76._4_4_;
      auVar76._8_4_ = auVar76._12_4_;
      auVar74 = pshuflw(auVar70,auVar76,0xe8);
      auVar40._8_4_ = 0xffffffff;
      auVar40._0_8_ = 0xffffffffffffffff;
      auVar40._12_4_ = 0xffffffff;
      auVar40 = (auVar74 | auVar61 & auVar70) ^ auVar40;
      auVar40 = packssdw(auVar40,auVar40);
      cVar1 = (char)lVar33;
      if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar32[-0xf] = bVar28 + cVar1 + '@';
      }
      auVar61._4_4_ = iVar87;
      auVar61._0_4_ = iVar87;
      auVar61._8_4_ = iVar91;
      auVar61._12_4_ = iVar91;
      auVar76 = auVar75 & auVar61 | auVar76;
      auVar40 = packssdw(auVar76,auVar76);
      auVar74._8_4_ = 0xffffffff;
      auVar74._0_8_ = 0xffffffffffffffff;
      auVar74._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar74,auVar40 ^ auVar74);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40._0_4_ >> 8 & 1) != 0) {
        pcVar32[-0xe] = bVar28 + cVar1 + '?';
      }
      auVar40 = auVar59 ^ auVar24;
      auVar62._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
      auVar62._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
      auVar62._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
      auVar62._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
      auVar77._4_4_ = auVar62._0_4_;
      auVar77._0_4_ = auVar62._0_4_;
      auVar77._8_4_ = auVar62._8_4_;
      auVar77._12_4_ = auVar62._8_4_;
      iVar87 = -(uint)(auVar40._4_4_ == iVar51);
      iVar91 = -(uint)(auVar40._12_4_ == iVar73);
      auVar11._4_4_ = iVar87;
      auVar11._0_4_ = iVar87;
      auVar11._8_4_ = iVar91;
      auVar11._12_4_ = iVar91;
      auVar88._4_4_ = auVar62._4_4_;
      auVar88._0_4_ = auVar62._4_4_;
      auVar88._8_4_ = auVar62._12_4_;
      auVar88._12_4_ = auVar62._12_4_;
      auVar40 = auVar11 & auVar77 | auVar88;
      auVar40 = packssdw(auVar40,auVar40);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar2,auVar40 ^ auVar2);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40._0_4_ >> 0x10 & 1) != 0) {
        pcVar32[-0xd] = bVar28 + cVar1 + '>';
      }
      auVar40 = pshufhw(auVar40,auVar77,0x84);
      auVar12._4_4_ = iVar87;
      auVar12._0_4_ = iVar87;
      auVar12._8_4_ = iVar91;
      auVar12._12_4_ = iVar91;
      auVar74 = pshufhw(auVar62,auVar12,0x84);
      auVar70 = pshufhw(auVar40,auVar88,0x84);
      auVar41._8_4_ = 0xffffffff;
      auVar41._0_8_ = 0xffffffffffffffff;
      auVar41._12_4_ = 0xffffffff;
      auVar41 = (auVar70 | auVar74 & auVar40) ^ auVar41;
      auVar40 = packssdw(auVar41,auVar41);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40._0_4_ >> 0x18 & 1) != 0) {
        pcVar32[-0xc] = bVar28 + cVar1 + '=';
      }
      auVar40 = auVar58 ^ auVar24;
      auVar63._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
      auVar63._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
      auVar63._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
      auVar63._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
      auVar13._4_4_ = auVar63._0_4_;
      auVar13._0_4_ = auVar63._0_4_;
      auVar13._8_4_ = auVar63._8_4_;
      auVar13._12_4_ = auVar63._8_4_;
      auVar74 = pshuflw(auVar88,auVar13,0xe8);
      auVar42._0_4_ = -(uint)(auVar40._0_4_ == iVar49);
      auVar42._4_4_ = -(uint)(auVar40._4_4_ == iVar51);
      auVar42._8_4_ = -(uint)(auVar40._8_4_ == iVar72);
      auVar42._12_4_ = -(uint)(auVar40._12_4_ == iVar73);
      auVar78._4_4_ = auVar42._4_4_;
      auVar78._0_4_ = auVar42._4_4_;
      auVar78._8_4_ = auVar42._12_4_;
      auVar78._12_4_ = auVar42._12_4_;
      auVar40 = pshuflw(auVar42,auVar78,0xe8);
      auVar79._4_4_ = auVar63._4_4_;
      auVar79._0_4_ = auVar63._4_4_;
      auVar79._8_4_ = auVar63._12_4_;
      auVar79._12_4_ = auVar63._12_4_;
      auVar70 = pshuflw(auVar63,auVar79,0xe8);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 & auVar74,(auVar70 | auVar40 & auVar74) ^ auVar3);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pcVar32[-0xb] = bVar28 + cVar1 + '<';
      }
      auVar14._4_4_ = auVar63._0_4_;
      auVar14._0_4_ = auVar63._0_4_;
      auVar14._8_4_ = auVar63._8_4_;
      auVar14._12_4_ = auVar63._8_4_;
      auVar79 = auVar78 & auVar14 | auVar79;
      auVar70 = packssdw(auVar79,auVar79);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40,auVar70 ^ auVar4);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40._4_2_ >> 8 & 1) != 0) {
        pcVar32[-10] = bVar28 + cVar1 + ';';
      }
      auVar40 = auVar57 ^ auVar24;
      auVar64._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
      auVar64._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
      auVar64._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
      auVar64._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
      auVar80._4_4_ = auVar64._0_4_;
      auVar80._0_4_ = auVar64._0_4_;
      auVar80._8_4_ = auVar64._8_4_;
      auVar80._12_4_ = auVar64._8_4_;
      iVar87 = -(uint)(auVar40._4_4_ == iVar51);
      iVar91 = -(uint)(auVar40._12_4_ == iVar73);
      auVar15._4_4_ = iVar87;
      auVar15._0_4_ = iVar87;
      auVar15._8_4_ = iVar91;
      auVar15._12_4_ = iVar91;
      auVar89._4_4_ = auVar64._4_4_;
      auVar89._0_4_ = auVar64._4_4_;
      auVar89._8_4_ = auVar64._12_4_;
      auVar89._12_4_ = auVar64._12_4_;
      auVar40 = auVar15 & auVar80 | auVar89;
      auVar40 = packssdw(auVar40,auVar40);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar5,auVar40 ^ auVar5);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pcVar32[-9] = bVar28 + cVar1 + ':';
      }
      auVar40 = pshufhw(auVar40,auVar80,0x84);
      auVar16._4_4_ = iVar87;
      auVar16._0_4_ = iVar87;
      auVar16._8_4_ = iVar91;
      auVar16._12_4_ = iVar91;
      auVar74 = pshufhw(auVar64,auVar16,0x84);
      auVar70 = pshufhw(auVar40,auVar89,0x84);
      auVar43._8_4_ = 0xffffffff;
      auVar43._0_8_ = 0xffffffffffffffff;
      auVar43._12_4_ = 0xffffffff;
      auVar43 = (auVar70 | auVar74 & auVar40) ^ auVar43;
      auVar40 = packssdw(auVar43,auVar43);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40._6_2_ >> 8 & 1) != 0) {
        pcVar32[-8] = bVar28 + cVar1 + '9';
      }
      auVar40 = auVar56 ^ auVar24;
      auVar65._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
      auVar65._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
      auVar65._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
      auVar65._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
      auVar17._4_4_ = auVar65._0_4_;
      auVar17._0_4_ = auVar65._0_4_;
      auVar17._8_4_ = auVar65._8_4_;
      auVar17._12_4_ = auVar65._8_4_;
      auVar74 = pshuflw(auVar89,auVar17,0xe8);
      auVar44._0_4_ = -(uint)(auVar40._0_4_ == iVar49);
      auVar44._4_4_ = -(uint)(auVar40._4_4_ == iVar51);
      auVar44._8_4_ = -(uint)(auVar40._8_4_ == iVar72);
      auVar44._12_4_ = -(uint)(auVar40._12_4_ == iVar73);
      auVar81._4_4_ = auVar44._4_4_;
      auVar81._0_4_ = auVar44._4_4_;
      auVar81._8_4_ = auVar44._12_4_;
      auVar81._12_4_ = auVar44._12_4_;
      auVar40 = pshuflw(auVar44,auVar81,0xe8);
      auVar82._4_4_ = auVar65._4_4_;
      auVar82._0_4_ = auVar65._4_4_;
      auVar82._8_4_ = auVar65._12_4_;
      auVar82._12_4_ = auVar65._12_4_;
      auVar70 = pshuflw(auVar65,auVar82,0xe8);
      auVar66._8_4_ = 0xffffffff;
      auVar66._0_8_ = 0xffffffffffffffff;
      auVar66._12_4_ = 0xffffffff;
      auVar66 = (auVar70 | auVar40 & auVar74) ^ auVar66;
      auVar70 = packssdw(auVar66,auVar66);
      auVar40 = packsswb(auVar40 & auVar74,auVar70);
      if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (*(char (*) [8])(pcVar32 + -7))[0] = bVar28 + cVar1 + '8';
      }
      auVar18._4_4_ = auVar65._0_4_;
      auVar18._0_4_ = auVar65._0_4_;
      auVar18._8_4_ = auVar65._8_4_;
      auVar18._12_4_ = auVar65._8_4_;
      auVar82 = auVar81 & auVar18 | auVar82;
      auVar70 = packssdw(auVar82,auVar82);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar70 = packssdw(auVar70 ^ auVar6,auVar70 ^ auVar6);
      auVar40 = packsswb(auVar40,auVar70);
      if ((auVar40._8_2_ >> 8 & 1) != 0) {
        pcVar32[-6] = bVar28 + cVar1 + '7';
      }
      auVar40 = auVar55 ^ auVar24;
      auVar67._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
      auVar67._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
      auVar67._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
      auVar67._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
      auVar83._4_4_ = auVar67._0_4_;
      auVar83._0_4_ = auVar67._0_4_;
      auVar83._8_4_ = auVar67._8_4_;
      auVar83._12_4_ = auVar67._8_4_;
      iVar87 = -(uint)(auVar40._4_4_ == iVar51);
      iVar91 = -(uint)(auVar40._12_4_ == iVar73);
      auVar19._4_4_ = iVar87;
      auVar19._0_4_ = iVar87;
      auVar19._8_4_ = iVar91;
      auVar19._12_4_ = iVar91;
      auVar90._4_4_ = auVar67._4_4_;
      auVar90._0_4_ = auVar67._4_4_;
      auVar90._8_4_ = auVar67._12_4_;
      auVar90._12_4_ = auVar67._12_4_;
      auVar40 = auVar19 & auVar83 | auVar90;
      auVar40 = packssdw(auVar40,auVar40);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar7,auVar40 ^ auVar7);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pcVar32[-5] = bVar28 + cVar1 + '6';
      }
      auVar40 = pshufhw(auVar40,auVar83,0x84);
      auVar20._4_4_ = iVar87;
      auVar20._0_4_ = iVar87;
      auVar20._8_4_ = iVar91;
      auVar20._12_4_ = iVar91;
      auVar74 = pshufhw(auVar67,auVar20,0x84);
      auVar70 = pshufhw(auVar40,auVar90,0x84);
      auVar45._8_4_ = 0xffffffff;
      auVar45._0_8_ = 0xffffffffffffffff;
      auVar45._12_4_ = 0xffffffff;
      auVar45 = (auVar70 | auVar74 & auVar40) ^ auVar45;
      auVar40 = packssdw(auVar45,auVar45);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40._10_2_ >> 8 & 1) != 0) {
        pcVar32[-4] = bVar28 + cVar1 + '5';
      }
      auVar40 = auVar54 ^ auVar24;
      auVar68._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
      auVar68._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
      auVar68._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
      auVar68._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
      auVar21._4_4_ = auVar68._0_4_;
      auVar21._0_4_ = auVar68._0_4_;
      auVar21._8_4_ = auVar68._8_4_;
      auVar21._12_4_ = auVar68._8_4_;
      auVar74 = pshuflw(auVar90,auVar21,0xe8);
      auVar46._0_4_ = -(uint)(auVar40._0_4_ == iVar49);
      auVar46._4_4_ = -(uint)(auVar40._4_4_ == iVar51);
      auVar46._8_4_ = -(uint)(auVar40._8_4_ == iVar72);
      auVar46._12_4_ = -(uint)(auVar40._12_4_ == iVar73);
      auVar84._4_4_ = auVar46._4_4_;
      auVar84._0_4_ = auVar46._4_4_;
      auVar84._8_4_ = auVar46._12_4_;
      auVar84._12_4_ = auVar46._12_4_;
      auVar40 = pshuflw(auVar46,auVar84,0xe8);
      auVar85._4_4_ = auVar68._4_4_;
      auVar85._0_4_ = auVar68._4_4_;
      auVar85._8_4_ = auVar68._12_4_;
      auVar85._12_4_ = auVar68._12_4_;
      auVar70 = pshuflw(auVar68,auVar85,0xe8);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 & auVar74,(auVar70 | auVar40 & auVar74) ^ auVar8);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pcVar32[-3] = bVar28 + cVar1 + '4';
      }
      auVar22._4_4_ = auVar68._0_4_;
      auVar22._0_4_ = auVar68._0_4_;
      auVar22._8_4_ = auVar68._8_4_;
      auVar22._12_4_ = auVar68._8_4_;
      auVar85 = auVar84 & auVar22 | auVar85;
      auVar70 = packssdw(auVar85,auVar85);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40,auVar70 ^ auVar9);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40._12_2_ >> 8 & 1) != 0) {
        pcVar32[-2] = bVar28 + cVar1 + '3';
      }
      auVar40 = auVar52 ^ auVar24;
      auVar69._0_4_ = -(uint)(iVar49 < auVar40._0_4_);
      auVar69._4_4_ = -(uint)(iVar51 < auVar40._4_4_);
      auVar69._8_4_ = -(uint)(iVar72 < auVar40._8_4_);
      auVar69._12_4_ = -(uint)(iVar73 < auVar40._12_4_);
      auVar86._4_4_ = auVar69._0_4_;
      auVar86._0_4_ = auVar69._0_4_;
      auVar86._8_4_ = auVar69._8_4_;
      auVar86._12_4_ = auVar69._8_4_;
      iVar49 = -(uint)(auVar40._4_4_ == iVar51);
      iVar51 = -(uint)(auVar40._12_4_ == iVar73);
      auVar71._4_4_ = iVar49;
      auVar71._0_4_ = iVar49;
      auVar71._8_4_ = iVar51;
      auVar71._12_4_ = iVar51;
      auVar47._4_4_ = auVar69._4_4_;
      auVar47._0_4_ = auVar69._4_4_;
      auVar47._8_4_ = auVar69._12_4_;
      auVar47._12_4_ = auVar69._12_4_;
      auVar47 = auVar71 & auVar86 | auVar47;
      auVar40 = packssdw(auVar47,auVar47);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar10,auVar40 ^ auVar10);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pcVar32[-1] = bVar28 + cVar1 + '2';
      }
      auVar40 = pshufhw(auVar40,auVar86,0x84);
      in_XMM11 = pshufhw(auVar69,auVar71,0x84);
      in_XMM11 = in_XMM11 & auVar40;
      auVar23._4_4_ = auVar69._4_4_;
      auVar23._0_4_ = auVar69._4_4_;
      auVar23._8_4_ = auVar69._12_4_;
      auVar23._12_4_ = auVar69._12_4_;
      auVar40 = pshufhw(auVar40,auVar23,0x84);
      auVar48._8_4_ = 0xffffffff;
      auVar48._0_8_ = 0xffffffffffffffff;
      auVar48._12_4_ = 0xffffffff;
      auVar48 = (auVar40 | in_XMM11) ^ auVar48;
      auVar40 = packssdw(auVar48,auVar48);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40._14_2_ >> 8 & 1) != 0) {
        *pcVar32 = bVar28 + cVar1 + '1';
      }
      lVar38 = (long)DAT_00981f00;
      lVar53 = auVar60._8_8_;
      auVar60._0_8_ = auVar60._0_8_ + lVar38;
      lVar50 = DAT_00981f00._8_8_;
      auVar60._8_8_ = lVar53 + lVar50;
      lVar53 = auVar59._8_8_;
      auVar59._0_8_ = auVar59._0_8_ + lVar38;
      auVar59._8_8_ = lVar53 + lVar50;
      lVar53 = auVar58._8_8_;
      auVar58._0_8_ = auVar58._0_8_ + lVar38;
      auVar58._8_8_ = lVar53 + lVar50;
      lVar53 = auVar57._8_8_;
      auVar57._0_8_ = auVar57._0_8_ + lVar38;
      auVar57._8_8_ = lVar53 + lVar50;
      lVar53 = auVar56._8_8_;
      auVar56._0_8_ = auVar56._0_8_ + lVar38;
      auVar56._8_8_ = lVar53 + lVar50;
      lVar53 = auVar55._8_8_;
      auVar55._0_8_ = auVar55._0_8_ + lVar38;
      auVar55._8_8_ = lVar53 + lVar50;
      lVar53 = auVar54._8_8_;
      auVar54._0_8_ = auVar54._0_8_ + lVar38;
      auVar54._8_8_ = lVar53 + lVar50;
      lVar53 = auVar52._8_8_;
      auVar52._0_8_ = auVar52._0_8_ + lVar38;
      auVar52._8_8_ = lVar53 + lVar50;
      pcVar32 = pcVar32 + 0x10;
      lVar33 = lVar33 + -0x10;
      auVar40 = _DAT_00981f00;
    } while (-lVar33 != (ulong)(nVars + 0xfU & 0xfffffff0));
  }
  (*Line + nVars)[0] = '+';
  (*Line + nVars)[1] = '\0';
  uVar35 = 1;
  if (1 < (int)uVar34) {
    uVar35 = (ulong)uVar34;
  }
  bVar25 = true;
  iVar49 = 0;
  do {
    Line[iVar49][nVars] = (~bVar25 & 1U) * '\x02' + '+';
    local_58 = (uint)uVar35;
    if (0 < (int)uVar27) {
      uVar36 = 0;
      do {
        iVar51 = iVar49;
        if (nVars != 0x1f) {
          lVar33 = 0;
          piVar31 = pComp;
          do {
            strcpy(Line[(long)iVar49 + 1] + lVar33,Line[iVar49] + lVar33);
            bVar29 = Line[(long)iVar49 + 1][*piVar31 + lVar33];
            if ((byte)(bVar29 + 0xbf) < 0x1a) {
              bVar29 = bVar29 | 0x20;
LAB_003e0b7f:
              Line[(long)iVar49 + 1][lVar33 + *piVar31] = bVar29;
            }
            else if ((byte)(bVar29 + 0x9f) < 0x1a) {
              bVar29 = bVar29 - 0x20;
              goto LAB_003e0b7f;
            }
            piVar31 = piVar31 + 1;
            lVar33 = lVar33 + 8;
            iVar51 = iVar49 + local_58;
          } while (uVar35 * 8 - lVar33 != 0);
        }
        iVar49 = iVar51;
        lVar33 = (long)pPerm[uVar36];
        cVar1 = Line[iVar49][lVar33];
        Line[iVar49][lVar33] = Line[iVar49][lVar33 + 1];
        Line[iVar49][lVar33 + 1] = cVar1;
        uVar36 = uVar36 + 1;
      } while (uVar36 != uVar27);
    }
    bVar26 = !bVar25;
    bVar25 = false;
    if (bVar26) {
      if (iVar49 != uVar27 * 2 << (bVar28 & 0x1f)) {
        __assert_fail("n == 2*nPerms*nMints",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                      ,0x511,"void Nf_ManPreparePrint(int, int *, int *, char (*)[8])");
      }
      iVar49 = 0;
      uVar30 = 0;
      bVar25 = true;
      do {
        bVar26 = bVar25;
        if (0 < (int)uVar27) {
          uVar35 = 0;
          do {
            if (nVars != 0x1f) {
              pacVar37 = Line + iVar49;
              uVar34 = 0;
              do {
                printf("%8d : %d %3d %2d : %s\n",(ulong)(uVar34 + iVar49),uVar30,uVar35,
                       (ulong)uVar34,pacVar37);
                uVar34 = uVar34 + 1;
                pacVar37 = pacVar37 + 1;
              } while (local_58 != uVar34);
              iVar49 = iVar49 + uVar34;
            }
            uVar34 = (int)uVar35 + 1;
            uVar35 = (ulong)uVar34;
          } while (uVar34 != uVar27);
        }
        uVar30 = 1;
        bVar25 = false;
      } while (bVar26);
      return;
    }
  } while( true );
}

Assistant:

void Nf_ManPreparePrint( int nVars, int * pComp, int * pPerm, char Line[2*720*64][8] )
{
    int nPerms = Extra_Factorial( nVars );
    int nMints = (1 << nVars);
    char * pChar, * pChar2;
    int i, p, c, n = 0;
    for ( i = 0; i < nVars; i++ )
        Line[0][i] = 'A' + nVars - 1 - i;
    Line[0][nVars] = '+';
    Line[0][nVars+1] = 0;
    for ( i = 0; i < 2; i++ )
    {
        Line[n][nVars] = i ? '-' : '+';
        for ( p = 0; p < nPerms; p++ )
        {
            for ( c = 0; c < nMints; c++ )
            {
                strcpy( Line[n+1], Line[n] ); n++;
                pChar = &Line[n][pComp[c]];
                if ( *pChar >= 'A' && *pChar <= 'Z' )
                    *pChar += 'a' - 'A';
                else if ( *pChar >= 'a' && *pChar <= 'z' )
                    *pChar -= 'a' - 'A';
            }
            pChar  = &Line[n][pPerm[p]];
            pChar2 = pChar + 1;
            ABC_SWAP( char, *pChar, *pChar2 );
        }
    }
    assert( n == 2*nPerms*nMints );
    n = 0;
    for ( i = 0; i < 2; i++ )
        for ( p = 0; p < nPerms; p++ )
            for ( c = 0; c < nMints; c++ )
                printf("%8d : %d %3d %2d : %s\n", n, i, p, c, Line[n]), n++;
}